

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

uint __thiscall ON_MeshComponentRef::GetMeshFace(ON_MeshComponentRef *this,ON_MeshFace **mesh_face)

{
  TYPE TVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ON_MeshNgon *pOVar6;
  ON_MeshFace *pOVar7;
  ON_MeshNgon *ngon;
  ON_MeshFace **mesh_face_local;
  ON_MeshComponentRef *this_local;
  
  if ((this->m_mesh != (ON_Mesh *)0x0) && (-1 < (this->m_mesh_ci).m_index)) {
    TVar1 = (this->m_mesh_ci).m_type;
    if (TVar1 == mesh_face) {
      iVar2 = (this->m_mesh_ci).m_index;
      iVar4 = ON_SimpleArray<ON_MeshFace>::Count(&this->m_mesh->m_F);
      if (iVar2 < iVar4) {
        pOVar7 = ON_SimpleArray<ON_MeshFace>::operator[]
                           (&this->m_mesh->m_F,(this->m_mesh_ci).m_index);
        *mesh_face = pOVar7;
        return (this->m_mesh_ci).m_index;
      }
    }
    else if ((((TVar1 == mesh_ngon) &&
              (pOVar6 = ON_Mesh::Ngon(this->m_mesh,(this->m_mesh_ci).m_index),
              pOVar6 != (ON_MeshNgon *)0x0)) && (pOVar6->m_Fcount == 1)) &&
            ((pOVar6->m_fi != (uint *)0x0 &&
             (uVar3 = *pOVar6->m_fi,
             uVar5 = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&this->m_mesh->m_F), uVar3 < uVar5))
            )) {
      pOVar7 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_mesh->m_F,*pOVar6->m_fi);
      *mesh_face = pOVar7;
      return *pOVar6->m_fi;
    }
  }
  *mesh_face = (ON_MeshFace *)0x0;
  return 0xffffffff;
}

Assistant:

unsigned int ON_MeshComponentRef::GetMeshFace(
  const ON_MeshFace*& mesh_face
  ) const
{
  if ( 0 != m_mesh && m_mesh_ci.m_index >= 0 )
  {
    switch(m_mesh_ci.m_type)
    {     
    case ON_COMPONENT_INDEX::mesh_face:
      if ( m_mesh_ci.m_index < m_mesh->m_F.Count() )
      {
        mesh_face = &m_mesh->m_F[m_mesh_ci.m_index];
        return (unsigned int)m_mesh_ci.m_index;
      }
      break;

    case ON_COMPONENT_INDEX::mesh_ngon:
      {
        const ON_MeshNgon* ngon = m_mesh->Ngon(m_mesh_ci.m_index);
        if ( 0 != ngon && 1 == ngon->m_Fcount && 0 != ngon->m_fi )
        {
          if ( ngon->m_fi[0] < m_mesh->m_F.UnsignedCount() )
          {
            mesh_face = &m_mesh->m_F[ngon->m_fi[0]];
            return ngon->m_fi[0];
          }
        }
      }
      break;
    
    default:
      break;
    }
  }

  mesh_face = 0;
  return ON_UNSET_UINT_INDEX;
}